

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O3

void pta_free(matras_allocator *allocator,void *p)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  pair<std::_Rb_tree_iterator<void_*>,_std::_Rb_tree_iterator<void_*>_> pVar3;
  void *local_20;
  void *p_local;
  
  local_20 = p;
  if (AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var2 = AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (*(void **)(p_Var2 + 1) >= p) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(void **)(p_Var2 + 1) < p];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != &AllocatedBlocks._M_t._M_impl.super__Rb_tree_header) &&
       (*(void **)(p_Var1 + 1) <= p)) {
      pVar3 = std::
              _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
              ::equal_range(&AllocatedBlocks._M_t,&local_20);
      std::
      _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>::
      _M_erase_aux(&AllocatedBlocks._M_t,(_Base_ptr)pVar3.first._M_node,
                   (_Base_ptr)pVar3.second._M_node);
      if (local_20 != (void *)0x0) {
        operator_delete__(local_20);
      }
      AllocatedCount = AllocatedCount - 1;
      return;
    }
  }
  pta_free();
  std::_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
  ::~_Rb_tree((_Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
               *)allocator);
  return;
}

Assistant:

static void
pta_free(struct matras_allocator *allocator, void *p)
{
	(void)allocator;
	fail_unless(AllocatedBlocks.find(p) != AllocatedBlocks.end());
	AllocatedBlocks.erase(p);
	delete [] static_cast<char *>(p);
	AllocatedCount--;
}